

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O3

bool cfd::core::Transaction::CheckTxOutBuffer
               (uint8_t *buffer,size_t buf_size,uint64_t txout_num,size_t txout_num_size,
               void *tx_pointer,
               vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *txout_list)

{
  int64_t *piVar1;
  int64_t satoshi_amount;
  bool bVar2;
  long lVar3;
  CfdException *this;
  ulong data_size;
  void *__src;
  bool bVar4;
  Amount AVar5;
  uint64_t script_size;
  size_t vnum_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_array;
  TxOut out;
  int ret;
  uint64_t local_158;
  _func_int **local_150;
  uint8_t *local_148;
  long local_140;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *local_138;
  void *local_130;
  long local_128;
  ulong local_120;
  size_t local_118;
  long local_110;
  uint64_t local_108;
  ulong local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  Amount local_e0;
  undefined1 local_d0 [16];
  _func_int *local_c0;
  Script local_b8;
  ByteData local_80;
  Script local_68;
  
  local_140 = buf_size - txout_num_size;
  if (buf_size < txout_num_size || local_140 == 0) {
    bVar4 = false;
  }
  else {
    if (txout_num == 0) {
      bVar4 = true;
      local_128 = 0;
    }
    else {
      local_148 = buffer + txout_num_size;
      local_110 = -txout_num;
      local_120 = 1;
      local_150 = (_func_int **)&PTR__AbstractTxOut_00259bc0;
      bVar4 = false;
      local_128 = 0;
      local_138 = txout_list;
      local_130 = tx_pointer;
      local_108 = txout_num;
      while (8 < (ulong)(local_140 - local_128)) {
        piVar1 = (int64_t *)(local_148 + local_128);
        satoshi_amount = *piVar1;
        data_size = (local_140 - local_128) - 8;
        local_158 = 0;
        local_118 = 0;
        bVar2 = AbstractTransaction::GetVariableInt
                          ((uint8_t *)(piVar1 + 1),data_size,&local_158,&local_118);
        if ((!bVar2) || (local_100 = local_158 + local_118, data_size < local_100)) break;
        __src = (void *)((long)(piVar1 + 1) + local_118);
        if ((local_130 != (void *)0x0) &&
           (local_68._vptr_Script._0_4_ =
                 wally_tx_add_raw_output(local_130,satoshi_amount,__src,local_158,0),
           (int)local_68._vptr_Script != 0)) {
          local_d0._0_8_ = "cfdcore_transaction.cpp";
          local_d0._8_4_ = 0x10f;
          local_c0 = (_func_int *)0x21ac75;
          logger::log<int&>((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,
                            "wally_tx_add_raw_output NG[{}].",(int *)&local_68);
          this = (CfdException *)__cxa_allocate_exception(0x30);
          local_d0._0_8_ = &local_c0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"vout add error.","")
          ;
          CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_d0);
          __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_138 != (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)0x0) {
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,local_158,
                     (allocator_type *)local_d0);
          memcpy(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,__src,
                 (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
          AVar5 = Amount::CreateBySatoshiAmount(satoshi_amount);
          local_e0.amount_ = AVar5.amount_;
          local_e0.ignore_check_ = AVar5.ignore_check_;
          ByteData::ByteData(&local_80,&local_f8);
          Script::Script(&local_68,&local_80);
          TxOut::TxOut((TxOut *)local_d0,&local_e0,&local_68);
          Script::~Script(&local_68);
          if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::push_back
                    (local_138,(value_type *)local_d0);
          local_d0._0_8_ = local_150;
          Script::~Script(&local_b8);
          if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        local_128 = local_128 + local_100 + 8;
        bVar4 = local_108 <= local_120;
        lVar3 = local_110 + local_120;
        local_120 = local_120 + 1;
        if (lVar3 == 0) break;
      }
    }
    bVar4 = (bool)(local_140 == local_128 & bVar4);
  }
  return bVar4;
}

Assistant:

bool Transaction::CheckTxOutBuffer(
    const uint8_t *buffer, size_t buf_size, uint64_t txout_num,
    size_t txout_num_size, void *tx_pointer, std::vector<TxOut> *txout_list) {
  bool is_success = false;
  if (buf_size > txout_num_size) {
    size_t data_size = buf_size - txout_num_size;
    size_t offset = 0;
    const uint8_t *address_pointer = buffer;
    address_pointer += txout_num_size;
    bool is_error = false;
    for (uint64_t index = 0; index < txout_num; ++index) {
      const uint8_t *work_address = &address_pointer[offset];
      size_t limit = data_size - offset;
      size_t total = 0;
      // check for value
      if (limit <= sizeof(int64_t)) {
        is_error = true;
        break;
      }
      uint64_t amount;
      memcpy(&amount, work_address, sizeof(amount));
      work_address += sizeof(uint64_t);
      limit -= sizeof(uint64_t);
      total += sizeof(uint64_t);
      // Check locking script
      uint64_t script_size = 0;
      size_t vnum_size = 0;
      if (!GetVariableInt(work_address, limit, &script_size, &vnum_size)) {
        is_error = true;
        break;
      } else if (limit < (vnum_size + script_size)) {
        is_error = true;
        break;
      }
      work_address += vnum_size;
      total += vnum_size + script_size;
      offset += total;

      // Copy of TxOut
      if (tx_pointer != NULL) {
        int ret = wally_tx_add_raw_output(
            static_cast<struct wally_tx *>(tx_pointer), amount, work_address,
            script_size, 0);
        if (ret != WALLY_OK) {
          warn(CFD_LOG_SOURCE, "wally_tx_add_raw_output NG[{}].", ret);
          throw CfdException(kCfdIllegalStateError, "vout add error.");
        }
      }
      if (txout_list != nullptr) {
        std::vector<uint8_t> byte_array(script_size);
        memcpy(byte_array.data(), work_address, byte_array.size());
        TxOut out(
            Amount::CreateBySatoshiAmount(amount),
            Script(ByteData(byte_array)));
        txout_list->push_back(out);
      }
    }

    if ((!is_error) && (data_size == offset)) {
      is_success = true;
    }
  }
  return is_success;
}